

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderTag.cpp
# Opt level: O1

int __thiscall
HeaderTag::verify(HeaderTag *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
                 size_t tbslen)

{
  StreamObjectVector *pSVar1;
  ulong uVar2;
  
  pSVar1 = Tag::elements(&this->super_Tag);
  uVar2 = (long)(pSVar1->super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pSVar1->super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
  if (0x10 < uVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: (HeaderTag): too many entries!",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    pSVar1 = (StreamObjectVector *)std::ostream::flush();
  }
  return (int)CONCAT71((int7)((ulong)pSVar1 >> 8),uVar2 < 0x11);
}

Assistant:

bool HeaderTag::verify()
{
	if (elements().size() > 2)
	{
		std::cerr << "Error: (HeaderTag): too many entries!" << std::endl;
		return false;
	}

	return true;
}